

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

bool __thiscall
spvtools::val::ValidationState_t::IsUnsignedIntScalarOrVectorType
          (ValidationState_t *this,uint32_t id)

{
  uint16_t uVar1;
  Instruction *this_00;
  bool bVar2;
  uint uVar3;
  uint32_t id_00;
  const_iterator cVar4;
  key_type_conflict local_14;
  
  cVar4 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,&local_14);
  if ((cVar4.
       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (this_00 = *(Instruction **)
                 ((long)cVar4.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                        ._M_cur + 0x10), this_00 != (Instruction *)0x0)) {
    uVar1 = (this_00->inst_).opcode;
    if (uVar1 == 0x17) {
      id_00 = GetComponentType(this,id);
      bVar2 = IsUnsignedIntScalarType(this,id_00);
      return bVar2;
    }
    if (uVar1 == 0x15) {
      uVar3 = Instruction::GetOperandAs<unsigned_int>(this_00,2);
      return uVar3 == 0;
    }
  }
  return false;
}

Assistant:

bool ValidationState_t::IsUnsignedIntScalarOrVectorType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    return false;
  }

  if (inst->opcode() == spv::Op::OpTypeInt) {
    return inst->GetOperandAs<uint32_t>(2) == 0;
  }

  if (inst->opcode() == spv::Op::OpTypeVector) {
    return IsUnsignedIntScalarType(GetComponentType(id));
  }

  return false;
}